

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O1

bool __thiscall Json::Value::isConvertibleTo(Value *this,ValueType other)

{
  byte bVar1;
  char cVar2;
  ushort uVar3;
  int iVar4;
  byte bVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  string local_40;
  
  switch(other) {
  case nullValue:
    if ((ushort)((byte)this->field_0x8 - 1) < 3) {
      dVar7 = asDouble(this);
      if ((dVar7 != 0.0) || (NAN(dVar7))) goto LAB_0010da15;
LAB_0010da28:
      bVar5 = true;
      bVar6 = false;
    }
    else {
LAB_0010da15:
      bVar5 = true;
      if ((this->field_0x8 == '\x05') && ((this->value_).bool_ == false)) goto LAB_0010da28;
      bVar6 = this->field_0x8 == '\x04';
      if (bVar6) {
        asString_abi_cxx11_(&local_40,this);
        iVar4 = std::__cxx11::string::compare((char *)&local_40);
        if (iVar4 != 0) goto LAB_0010da59;
        bVar6 = true;
        bVar5 = true;
      }
      else {
LAB_0010da59:
        cVar2 = (char)*(ushort *)&this->field_0x8;
        uVar3 = *(ushort *)&this->field_0x8 & 0xff;
        if (cVar2 == '\a') {
LAB_0010da7a:
          if ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)
          goto LAB_0010da98;
        }
        else if (cVar2 == '\x06') {
          if ((((this->value_).map_)->_M_t)._M_impl.super__Rb_tree_header._M_node_count == 0)
          goto LAB_0010da98;
          if (uVar3 == 7) goto LAB_0010da7a;
        }
        bVar5 = uVar3 == 0;
      }
    }
LAB_0010da98:
    if ((bVar6) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2)) {
      operator_delete(local_40._M_dataplus._M_p);
    }
    goto LAB_0010da05;
  case intValue:
    bVar6 = isInt(this);
    bVar5 = 1;
    if (bVar6) goto LAB_0010da05;
    bVar1 = this->field_0x8;
    if ((bVar1 == 3) && (dVar7 = (this->value_).real_, -2147483648.0 <= dVar7)) {
      dVar8 = 2147483647.0;
LAB_0010d9bb:
      bVar5 = 1;
      if (dVar7 <= dVar8) goto LAB_0010da05;
    }
    goto LAB_0010d9c1;
  case uintValue:
    bVar6 = isUInt(this);
    bVar5 = 1;
    if (bVar6) goto LAB_0010da05;
    bVar1 = this->field_0x8;
    if ((bVar1 == 3) && (dVar7 = (this->value_).real_, 0.0 <= dVar7)) {
      dVar8 = 4294967295.0;
      goto LAB_0010d9bb;
    }
LAB_0010d9c1:
    bVar6 = bVar1 == 5;
    break;
  case realValue:
  case booleanValue:
    bVar1 = this->field_0x8;
    bVar5 = 1;
    if ((ushort)(bVar1 - 1) < 3) goto LAB_0010da05;
    bVar6 = bVar1 == 5;
    break;
  case stringValue:
    bVar1 = this->field_0x8;
    bVar5 = 1;
    if (2 < (ushort)(bVar1 - 1)) {
      if (bVar1 < 6) {
        bVar5 = 0x31 >> (bVar1 & 0x1f);
      }
      else {
        bVar5 = 0;
      }
    }
    goto LAB_0010da05;
  case arrayValue:
    bVar1 = this->field_0x8;
    bVar6 = bVar1 == 6;
    break;
  case objectValue:
    bVar1 = this->field_0x8;
    bVar6 = bVar1 == 7;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kong36088[P]LeetCodeLib/lib/jsoncpp.cpp"
                  ,0xd1a,"bool Json::Value::isConvertibleTo(ValueType) const");
  }
  bVar5 = bVar1 == 0 | bVar6;
LAB_0010da05:
  return (bool)(bVar5 & 1);
}

Assistant:

bool Value::isConvertibleTo(ValueType other) const {
  switch (other) {
  case nullValue:
    return (isNumeric() && asDouble() == 0.0) ||
           (type_ == booleanValue && value_.bool_ == false) ||
           (type_ == stringValue && asString() == "") ||
           (type_ == arrayValue && value_.map_->size() == 0) ||
           (type_ == objectValue && value_.map_->size() == 0) ||
           type_ == nullValue;
  case intValue:
    return isInt() ||
           (type_ == realValue && InRange(value_.real_, minInt, maxInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case uintValue:
    return isUInt() ||
           (type_ == realValue && InRange(value_.real_, 0, maxUInt)) ||
           type_ == booleanValue || type_ == nullValue;
  case realValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case booleanValue:
    return isNumeric() || type_ == booleanValue || type_ == nullValue;
  case stringValue:
    return isNumeric() || type_ == booleanValue || type_ == stringValue ||
           type_ == nullValue;
  case arrayValue:
    return type_ == arrayValue || type_ == nullValue;
  case objectValue:
    return type_ == objectValue || type_ == nullValue;
  }
  JSON_ASSERT_UNREACHABLE;
  return false;
}